

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O1

void __thiscall
llama_kv_cache_unified::seq_div
          (llama_kv_cache_unified *this,llama_seq_id seq_id,llama_pos p0,llama_pos p1,int d)

{
  int iVar1;
  uint uVar2;
  pointer plVar3;
  _Base_ptr p_Var4;
  long lVar5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  _Rb_tree_header *p_Var8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  pointer plVar12;
  
  if (d != 1) {
    iVar9 = 0;
    if (0 < p0) {
      iVar9 = p0;
    }
    iVar10 = 0x7fffffff;
    if ((uint)p1 < 0x7fffffff) {
      iVar10 = p1;
    }
    if (iVar9 != iVar10) {
      if (this->recurrent == false) {
        uVar2 = this->size;
        if ((ulong)uVar2 != 0) {
          plVar3 = (this->cells).super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar11 = 0;
          do {
            p_Var7 = (_Rb_tree_header *)((long)&plVar3[uVar11].seq_id._M_t._M_impl + 8);
            p_Var6 = (_Base_ptr)p_Var7;
            for (p_Var4 = *(_Base_ptr *)((long)&plVar3[uVar11].seq_id._M_t._M_impl + 0x10);
                (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
                p_Var4 = (&p_Var4->_M_left)[(int)*(size_t *)(p_Var4 + 1) < seq_id]) {
              if (seq_id <= (int)*(size_t *)(p_Var4 + 1)) {
                p_Var6 = p_Var4;
              }
            }
            p_Var8 = p_Var7;
            if (((_Rb_tree_header *)p_Var6 != p_Var7) &&
               (p_Var8 = (_Rb_tree_header *)p_Var6,
               seq_id < (int)((_Rb_tree_header *)p_Var6)->_M_node_count)) {
              p_Var8 = p_Var7;
            }
            if (p_Var8 != p_Var7) {
              plVar12 = plVar3 + uVar11;
              iVar1 = plVar12->pos;
              if (iVar1 < iVar10 && iVar9 <= iVar1) {
                this->has_shift = true;
                plVar12->pos = iVar1 / d;
                plVar12->delta = plVar12->delta + (iVar1 / d - iVar1);
              }
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 != uVar2);
        }
      }
      else if ((-1 < seq_id) && ((uint)seq_id < this->size)) {
        plVar3 = (this->cells).super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar5 = (long)plVar3[(uint)seq_id].tail;
        if (-1 < lVar5) {
          p_Var7 = (_Rb_tree_header *)((long)&plVar3[lVar5].seq_id._M_t._M_impl + 8);
          p_Var6 = (_Base_ptr)p_Var7;
          for (p_Var4 = *(_Base_ptr *)((long)&plVar3[lVar5].seq_id._M_t._M_impl + 0x10);
              (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
              p_Var4 = (&p_Var4->_M_left)[(int)*(size_t *)(p_Var4 + 1) < seq_id]) {
            if (seq_id <= (int)*(size_t *)(p_Var4 + 1)) {
              p_Var6 = p_Var4;
            }
          }
          p_Var8 = p_Var7;
          if (((_Rb_tree_header *)p_Var6 != p_Var7) &&
             (p_Var8 = (_Rb_tree_header *)p_Var6,
             seq_id < (int)((_Rb_tree_header *)p_Var6)->_M_node_count)) {
            p_Var8 = p_Var7;
          }
          if (p_Var8 != p_Var7) {
            iVar1 = plVar3[lVar5].pos;
            if (iVar1 < iVar10 && iVar9 <= iVar1) {
              plVar3[lVar5].pos = iVar1 / d;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void llama_kv_cache_unified::seq_div(llama_seq_id seq_id, llama_pos p0, llama_pos p1, int d) {
    if (d == 1) {
        return;
    }

    if (p0 < 0) {
        p0 = 0;
    }

    if (p1 < 0) {
        p1 = std::numeric_limits<llama_pos>::max();
    }

    // If there is no range then return early to avoid looping over the cache.
    if (p0 == p1) {
        return;
    }

    if (recurrent) {
        // for Mamba-like or RWKV models, only the pos needs to be changed
        if (0 <= seq_id && seq_id < (int64_t) size) {
            const int32_t tail_id = cells[seq_id].tail;
            if (tail_id >= 0) {
                llama_kv_cell & cell = cells[tail_id];
                if (cell.has_seq_id(seq_id) && p0 <= cell.pos && cell.pos < p1) {
                    cell.pos /= d;
                }
            }
        }

        return;
    }

    for (uint32_t i = 0; i < size; ++i) {
        if (cells[i].has_seq_id(seq_id) && cells[i].pos >= p0 && cells[i].pos < p1) {
            has_shift = true;

            {
                llama_pos p_old = cells[i].pos;
                cells[i].pos   /= d;
                cells[i].delta += cells[i].pos - p_old;
            }
        }
    }
}